

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLEBABecLap::setEBHomogDirichlet
          (MLEBABecLap *this,int amrlev,Vector<double,_std::allocator<double>_> *hv_beta)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  pointer pFVar4;
  iterator pdVar5;
  MFItInfo *this_00;
  Geometry *this_01;
  long *in_RDI;
  int i_2;
  int j_2;
  int k_2;
  int n_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Array4<const_amrex::EBCellFlag> *flag;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType t;
  Array4<double> *betaout;
  Array4<double> *phifab;
  Box *bx;
  MFIter mfi;
  MFItInfo mfi_info;
  Real *beta;
  DeviceVector<Real> dv_beta;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  int mglev_1;
  int ngrow;
  int mglev;
  bool phi_on_centroid;
  int ncomp;
  MFIter *in_stack_fffffffffffff958;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff96c;
  MFItInfo *in_stack_fffffffffffff970;
  undefined1 cross;
  undefined4 in_stack_fffffffffffff978;
  FabType in_stack_fffffffffffff97c;
  FabArray<amrex::FArrayBox> *this_02;
  MFInfo *in_stack_fffffffffffff988;
  FabArrayBase *fabarray_;
  int *in_stack_fffffffffffff990;
  int *in_stack_fffffffffffff998;
  DistributionMapping *in_stack_fffffffffffff9a0;
  BoxArray *in_stack_fffffffffffff9a8;
  MFIter *in_stack_fffffffffffff9c0;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  MFItInfo local_598;
  Box *in_stack_fffffffffffffa80;
  EBCellFlagFab *in_stack_fffffffffffffa88;
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  long local_4b0 [8];
  long *local_470;
  long local_468 [8];
  long *local_428;
  int local_41c [7];
  int *local_400;
  MFIter local_3f8;
  undefined1 local_394 [76];
  FabArray<amrex::EBCellFlagFab> *local_348;
  long local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined4 local_304;
  int local_2f8;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  int aiStack_2d0 [6];
  uint local_2b8;
  int local_2b4;
  byte local_2ad;
  int local_2ac;
  undefined8 local_290;
  int local_288;
  int *local_280;
  int local_274;
  int iStack_270;
  int local_26c;
  undefined8 local_268;
  int local_260;
  int *local_258;
  int local_24c;
  int iStack_248;
  int local_244;
  undefined8 local_240;
  int local_238;
  int *local_230;
  int local_224;
  int iStack_220;
  int local_21c;
  undefined8 local_218;
  int local_210;
  int *local_208;
  int local_1fc;
  int iStack_1f8;
  int local_1f4;
  undefined8 local_1f0;
  int local_1e8;
  int *local_1e0;
  int local_1d4;
  int iStack_1d0;
  int local_1cc;
  undefined8 local_1c8;
  int local_1c0;
  int *local_1b8;
  int local_1ac;
  int iStack_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  long *local_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  long *local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  long *local_160;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  long *local_148;
  int local_13c;
  int local_138;
  int local_134;
  MFItInfo *local_130;
  uint *local_128;
  undefined4 local_11c;
  int *local_118;
  undefined4 local_10c;
  int *local_108;
  undefined4 local_fc;
  int *local_f8;
  undefined4 local_ec;
  int *local_e8;
  undefined4 local_dc;
  int *local_d8;
  undefined4 local_cc;
  int *local_c8;
  undefined4 local_bc;
  int *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  int *local_88;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  int *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_2ac = (**(code **)(*in_RDI + 0x28))();
  local_2ad = *(int *)((long)in_RDI + 0x32c) == 3;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
  bVar2 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  if (bVar2) {
    local_2b4 = 0;
    local_2b8 = local_2ad & 1;
    Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                  *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                  *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    local_2d8 = 0;
    aiStack_2d0[0] = 0;
    aiStack_2d0[1] = 0;
    local_2e8 = 0;
    uStack_2e0 = 0;
    aiStack_2d0._8_8_ = 0;
    MFInfo::MFInfo((MFInfo *)0x14e22f1);
    Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                  *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                  *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    in_stack_fffffffffffff958 =
         (MFIter *)
         std::
         unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                      *)in_stack_fffffffffffff960);
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
               in_stack_fffffffffffff990,in_stack_fffffffffffff988,
               (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff9c0);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff960,
               (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff958);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
               in_stack_fffffffffffff960);
    MFInfo::~MFInfo((MFInfo *)0x14e23b7);
  }
  Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
  bVar2 = std::operator==((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                          in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  if (bVar2) {
    for (local_2f8 = 0; iVar1 = local_2f8,
        piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960,
                            (size_type)in_stack_fffffffffffff958), iVar1 < *piVar3;
        local_2f8 = local_2f8 + 1) {
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
      Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
                 in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
      local_304 = 0;
      local_328 = 0;
      uStack_320 = 0;
      local_338 = 0;
      uStack_330 = 0;
      local_318 = 0;
      MFInfo::MFInfo((MFInfo *)0x14e24f3);
      Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
      Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
      in_stack_fffffffffffff958 =
           (MFIter *)
           std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)in_stack_fffffffffffff960);
      in_stack_fffffffffffff9c0 = in_stack_fffffffffffff958;
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,
                 in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                 (FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff958);
      Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                    *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
      Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator=
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff960,
                 (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff958);
      std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr
                ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                 in_stack_fffffffffffff960);
      MFInfo::~MFInfo((MFInfo *)0x14e25c0);
    }
  }
  Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
  Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
  pFVar4 = std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                  *)in_stack_fffffffffffff960);
  if (pFVar4 == (pointer)0x0) {
    local_340 = 0;
  }
  else {
    local_340 = __dynamic_cast(pFVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
  }
  if (local_340 == 0) {
    local_348 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_348 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_fffffffffffff960);
  }
  Vector<double,_std::allocator<double>_>::size
            ((Vector<double,_std::allocator<double>_> *)0x14e26b4);
  this_02 = (FabArray<amrex::FArrayBox> *)(local_394 + 0x34);
  PODVector<double,_std::allocator<double>_>::PODVector
            ((PODVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff960,
             (size_type)in_stack_fffffffffffff958);
  local_394._36_8_ =
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff958);
  local_394._28_8_ =
       std::vector<double,_std::allocator<double>_>::end
                 ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff958);
  pdVar5 = PODVector<double,_std::allocator<double>_>::begin
                     ((PODVector<double,_std::allocator<double>_> *)this_02);
  Gpu::
  copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double*>
            (local_394._36_8_,local_394._28_8_,pdVar5);
  local_394._20_8_ =
       PODVector<double,_std::allocator<double>_>::data
                 ((PODVector<double,_std::allocator<double>_> *)this_02);
  fabarray_ = (FabArrayBase *)local_394;
  MFItInfo::MFItInfo(in_stack_fffffffffffff970);
  this_00 = MFItInfo::EnableTiling((MFItInfo *)fabarray_,(IntVect *)&FabArrayBase::mfiter_tile_size)
  ;
  MFItInfo::SetDynamic(this_00,true);
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
  this_01 = (Geometry *)
            std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                      ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                       in_stack_fffffffffffff960);
  MFIter::MFIter((MFIter *)this_01,fabarray_,(MFItInfo *)this_02);
  while( true ) {
    bVar2 = MFIter::isValid((MFIter *)(local_41c + 9));
    cross = (undefined1)((ulong)in_stack_fffffffffffff970 >> 0x38);
    if (!bVar2) break;
    MFIter::tilebox(in_stack_fffffffffffff9c0);
    local_400 = local_41c;
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14e2832);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (MFIter *)in_stack_fffffffffffff960);
    local_428 = local_468;
    Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
              ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14e288a);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
               (MFIter *)in_stack_fffffffffffff960);
    local_470 = local_4b0;
    if (local_348 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
      in_stack_fffffffffffff97c = regular;
    }
    else {
      FabArray<amrex::EBCellFlagFab>::operator[]
                (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
      in_stack_fffffffffffff97c =
           EBCellFlagFab::getType(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    }
    local_230 = local_400;
    local_68 = local_400;
    local_6c = 0;
    local_224 = *local_400;
    local_78 = local_400;
    local_7c = 1;
    iStack_220 = local_400[1];
    local_240 = *(undefined8 *)local_400;
    local_88 = local_400;
    local_8c = 2;
    local_238 = local_400[2];
    local_1b8 = local_400;
    local_f8 = local_400 + 3;
    local_fc = 0;
    local_1ac = *local_f8;
    local_108 = local_400 + 3;
    local_10c = 1;
    iStack_1a8 = local_400[4];
    local_1c8 = *(undefined8 *)local_f8;
    local_118 = local_400 + 3;
    local_11c = 2;
    local_1c0 = local_400[5];
    for (local_4f4 = 0; local_4f8 = local_238, local_4f4 < local_2ac; local_4f4 = local_4f4 + 1) {
      for (; local_4fc = iStack_220, local_4f8 <= local_1c0; local_4f8 = local_4f8 + 1) {
        for (; local_500 = local_224, local_4fc <= iStack_1a8; local_4fc = local_4fc + 1) {
          for (; local_500 <= local_1ac; local_500 = local_500 + 1) {
            local_148 = local_428;
            local_14c = local_500;
            local_150 = local_4fc;
            local_154 = local_4f8;
            local_158 = local_4f4;
            *(undefined8 *)
             (*local_428 +
             ((long)(local_500 - (int)local_428[4]) +
              (long)(local_4fc - *(int *)((long)local_428 + 0x24)) * local_428[1] +
              (long)(local_4f8 - (int)local_428[5]) * local_428[2] + (long)local_4f4 * local_428[3])
             * 8) = 0;
          }
        }
      }
    }
    local_21c = local_238;
    local_1a4 = local_1c0;
    if ((in_stack_fffffffffffff97c == regular) || (in_stack_fffffffffffff97c == covered)) {
      local_258 = local_400;
      local_38 = local_400;
      local_3c = 0;
      local_24c = *local_400;
      local_48 = local_400;
      local_4c = 1;
      iStack_248 = local_400[1];
      local_268 = *(undefined8 *)local_400;
      local_58 = local_400;
      local_5c = 2;
      local_260 = local_400[2];
      local_1e0 = local_400;
      local_c8 = local_400 + 3;
      local_cc = 0;
      local_1d4 = *local_c8;
      local_d8 = local_400 + 3;
      local_dc = 1;
      iStack_1d0 = local_400[4];
      local_1f0 = *(undefined8 *)local_c8;
      local_e8 = local_400 + 3;
      local_ec = 2;
      local_1e8 = local_400[5];
      for (local_544 = 0; local_548 = local_260, local_244 = local_260, local_1cc = local_1e8,
          local_544 < local_2ac; local_544 = local_544 + 1) {
        for (; local_54c = iStack_248, local_548 <= local_1e8; local_548 = local_548 + 1) {
          for (; local_550 = local_24c, local_54c <= iStack_1d0; local_54c = local_54c + 1) {
            for (; local_550 <= local_1d4; local_550 = local_550 + 1) {
              local_160 = local_470;
              local_164 = local_550;
              local_168 = local_54c;
              local_16c = local_548;
              local_170 = local_544;
              *(undefined8 *)
               (*local_470 +
               ((long)(local_550 - (int)local_470[4]) +
                (long)(local_54c - *(int *)((long)local_470 + 0x24)) * local_470[1] +
                (long)(local_548 - (int)local_470[5]) * local_470[2] +
               (long)local_544 * local_470[3]) * 8) = 0;
            }
          }
        }
      }
    }
    else {
      in_stack_fffffffffffff970 = &local_598;
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                ((FabArray<amrex::EBCellFlagFab> *)
                 CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
                 (MFIter *)in_stack_fffffffffffff960);
      local_280 = local_400;
      local_8 = local_400;
      local_c = 0;
      local_274 = *local_400;
      local_18 = local_400;
      local_1c = 1;
      iStack_270 = local_400[1];
      local_290 = *(undefined8 *)local_400;
      local_28 = local_400;
      local_2c = 2;
      local_288 = local_400[2];
      local_208 = local_400;
      local_98 = local_400 + 3;
      local_9c = 0;
      local_1fc = *local_98;
      local_a8 = local_400 + 3;
      local_ac = 1;
      iStack_1f8 = local_400[4];
      local_218 = *(undefined8 *)local_98;
      local_b8 = local_400 + 3;
      local_bc = 2;
      local_210 = local_400[5];
      for (local_5dc = 0; local_5e0 = local_288, local_26c = local_288, local_1f4 = local_210,
          local_5dc < local_2ac; local_5dc = local_5dc + 1) {
        for (; local_5e4 = iStack_270, local_5e0 <= local_210; local_5e0 = local_5e0 + 1) {
          for (; local_5e8 = local_274, local_5e4 <= iStack_1f8; local_5e4 = local_5e4 + 1) {
            for (; local_5e8 <= local_1fc; local_5e8 = local_5e8 + 1) {
              local_134 = local_5e8;
              local_138 = local_5e4;
              local_13c = local_5e0;
              local_128 = (uint *)(*(long *)in_stack_fffffffffffff970 +
                                  ((long)(local_5e8 - in_stack_fffffffffffff970[1].tilesize.vect[1])
                                   + (long)(local_5e4 -
                                           in_stack_fffffffffffff970[1].tilesize.vect[2]) *
                                     *(long *)(in_stack_fffffffffffff970->tilesize).vect +
                                  (long)(local_5e0 - *(int *)(in_stack_fffffffffffff970 + 2)) *
                                  *(long *)((in_stack_fffffffffffff970->tilesize).vect + 2)) * 4);
              if ((*local_128 & 3) == 1) {
                local_178 = local_470;
                local_17c = local_5e8;
                local_180 = local_5e4;
                local_184 = local_5e0;
                local_188 = local_5dc;
                *(double *)
                 (*local_470 +
                 ((long)(local_5e8 - (int)local_470[4]) +
                  (long)(local_5e4 - *(int *)((long)local_470 + 0x24)) * local_470[1] +
                  (long)(local_5e0 - (int)local_470[5]) * local_470[2] +
                 (long)local_5dc * local_470[3]) * 8) =
                     *(double *)(local_394._20_8_ + (long)local_5dc * 8);
              }
              else {
                local_190 = local_470;
                local_194 = local_5e8;
                local_198 = local_5e4;
                local_19c = local_5e0;
                local_1a0 = local_5dc;
                *(undefined8 *)
                 (*local_470 +
                 ((long)(local_5e8 - (int)local_470[4]) +
                  (long)(local_5e4 - *(int *)((long)local_470 + 0x24)) * local_470[1] +
                  (long)(local_5e0 - (int)local_470[5]) * local_470[2] +
                 (long)local_5dc * local_470[3]) * 8) = 0;
              }
              local_130 = in_stack_fffffffffffff970;
            }
          }
        }
      }
    }
    MFIter::operator++((MFIter *)(local_41c + 9));
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffff960);
  if ((local_2ad & 1) != 0) {
    Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    in_stack_fffffffffffff960 =
         (FabArray<amrex::EBCellFlagFab> *)
         std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                   ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x14e35d9)
    ;
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffff960,(size_type)in_stack_fffffffffffff958);
    Geometry::periodicity(this_01);
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (this_02,(Periodicity *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
               (bool)cross);
  }
  PODVector<double,_std::allocator<double>_>::~PODVector
            ((PODVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff960);
  return;
}

Assistant:

void
MLEBABecLap::setEBHomogDirichlet (int amrlev, Vector<Real> const& hv_beta)
{
    const int ncomp = getNComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    Gpu::DeviceVector<Real> dv_beta(hv_beta.size());
    Gpu::copy(Gpu::hostToDevice, hv_beta.begin(), hv_beta.end(), dv_beta.begin());
    Real const* beta = dv_beta.data();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*m_eb_phi[amrlev], mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phifab = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            phifab(i,j,k,n) = 0.0;
        });
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            const auto& flag = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flag(i,j,k).isSingleValued()) {
                    betaout(i,j,k,n) = beta[n];
                } else {
                    betaout(i,j,k,n) = 0.0;
                }
            });
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}